

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O2

void __thiscall gdsSTR::to_str(gdsSTR *this)

{
  pointer pgVar1;
  pointer pgVar2;
  pointer pgVar3;
  pointer pgVar4;
  pointer pgVar5;
  uint uVar6;
  ostream *poVar7;
  
  poVar7 = std::operator<<((ostream *)&std::cout,"GDS STR class:");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"  Name: ");
  poVar7 = std::operator<<(poVar7,(string *)this);
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"  BBox: ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->bounding_box[0]);
  std::operator<<(poVar7,", ");
  poVar7 = (ostream *)std::ostream::operator<<(&std::cout,this->bounding_box[1]);
  std::operator<<(poVar7,"; ");
  poVar7 = (ostream *)std::ostream::operator<<(&std::cout,this->bounding_box[2]);
  std::operator<<(poVar7,", ");
  poVar7 = (ostream *)std::ostream::operator<<(&std::cout,this->bounding_box[3]);
  std::endl<char,std::char_traits<char>>(poVar7);
  uVar6 = 0;
  while( true ) {
    pgVar1 = (this->SREF).super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->SREF).super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pgVar1) / 0x78) <= (ulong)uVar6)
    break;
    gdsSREF::to_str(pgVar1 + uVar6);
    uVar6 = uVar6 + 1;
  }
  uVar6 = 0;
  while( true ) {
    pgVar2 = (this->BOUNDARY).super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->BOUNDARY).
                       super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pgVar2) / 0x68) <= (ulong)uVar6)
    break;
    gdsBOUNDARY::to_str(pgVar2 + uVar6);
    uVar6 = uVar6 + 1;
  }
  uVar6 = 0;
  while( true ) {
    pgVar3 = (this->PATH).super__Vector_base<gdsPATH,_std::allocator<gdsPATH>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->PATH).super__Vector_base<gdsPATH,_std::allocator<gdsPATH>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pgVar3) / 0x70) <= (ulong)uVar6)
    break;
    gdsPATH::to_str(pgVar3 + uVar6);
    uVar6 = uVar6 + 1;
  }
  uVar6 = 0;
  while( true ) {
    pgVar4 = (this->NODE).super__Vector_base<gdsNODE,_std::allocator<gdsNODE>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->NODE).super__Vector_base<gdsNODE,_std::allocator<gdsNODE>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pgVar4) / 0x68) <= (ulong)uVar6)
    break;
    gdsNODE::to_str(pgVar4 + uVar6);
    uVar6 = uVar6 + 1;
  }
  uVar6 = 0;
  while( true ) {
    pgVar5 = (this->TEXT).super__Vector_base<gdsTEXT,_std::allocator<gdsTEXT>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->TEXT).super__Vector_base<gdsTEXT,_std::allocator<gdsTEXT>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pgVar5) / 0x88) <= (ulong)uVar6)
    break;
    gdsTEXT::to_str(pgVar5 + uVar6);
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

void gdsSTR::to_str()
{
  cout << "GDS STR class:" << endl;

  cout << "  Name: " << this->name << endl;

  cout << "  BBox: " << bounding_box[0] << ", ";
  cout << bounding_box[1] << "; ";
  cout << bounding_box[2] << ", ";
  cout << bounding_box[3] << endl;

  for (unsigned int i = 0; i < this->SREF.size(); i++) {
    this->SREF[i].to_str();
  }

  for (unsigned int i = 0; i < this->BOUNDARY.size(); i++) {
    this->BOUNDARY[i].to_str();
  }

  for (unsigned int i = 0; i < this->PATH.size(); i++) {
    this->PATH[i].to_str();
  }

  for (unsigned int i = 0; i < this->NODE.size(); i++) {
    this->NODE[i].to_str();
  }

  for (unsigned int i = 0; i < this->TEXT.size(); i++) {
    this->TEXT[i].to_str();
  }
}